

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::conflictAnalyzeReconvergence
          (HighsDomain *this,HighsDomainChange *domchg,HighsInt *proofinds,double *proofvals,
          HighsInt prooflen,double proofrhs,HighsConflictPool *conflictPool)

{
  HighsDomain *this_00;
  pointer ppVar1;
  double dVar2;
  HighsMipSolverData *pHVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  LocalDomChg *__v;
  HighsInt ninfmin;
  HighsCDouble activitymin;
  _Alloc_node __an;
  ConflictSet conflictSet;
  int local_114;
  HighsCDouble local_110;
  LocalDomChg local_100;
  undefined1 local_e8 [64];
  _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  local_a8;
  pointer local_78;
  LocalDomChg *local_60;
  LocalDomChg *local_58;
  pointer local_48;
  
  pHVar3 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar3->domain;
  if (((this_00 != this) && ((pHVar3->domain).infeasible_ == false)) &&
     (propagate(this_00),
     (((this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).infeasible_ ==
     false)) {
    ConflictSet::ConflictSet((ConflictSet *)local_e8,this);
    computeMinActivity(&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,0
                       ,prooflen,proofinds,proofvals,&local_114,&local_110);
    if (local_114 == 0) {
      local_100.pos =
           (int)((ulong)((long)(this->domchgstack_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_100.domchg.boundval = domchg->boundval;
      local_100.domchg.column = domchg->column;
      local_100.domchg.boundtype = domchg->boundtype;
      bVar6 = ConflictSet::explainBoundChangeLeq
                        ((ConflictSet *)local_e8,
                         (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)&local_a8,&local_100,proofinds,proofvals,prooflen,proofrhs,
                         local_110.hi + local_110.lo);
      if ((bVar6) &&
         (pHVar3 = (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
         uVar9 = ((long)local_58 - (long)local_60 >> 3) * -0x5555555555555552,
         uVar8 = ((long)*(pointer *)
                         ((long)&(pHVar3->integral_cols).
                                 super__Vector_base<int,_std::allocator<int>_> + 8) -
                  *(long *)&(pHVar3->integral_cols).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl >> 2) * 3 + 1000, uVar9 < uVar8 || uVar9 - uVar8 == 0)) {
        local_100._0_8_ = &local_a8;
        if (local_60 != local_58) {
          __v = local_60;
          do {
            std::
            _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
            ::
            _M_insert_unique_<HighsDomain::ConflictSet::LocalDomChg&,std::_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>::_Alloc_node>
                      ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                        *)&local_a8,(const_iterator)&local_a8._M_impl.super__Rb_tree_header,__v,
                       (_Alloc_node *)&local_100);
            __v = __v + 1;
          } while (__v != local_58);
        }
        piVar4 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)((long)(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
        while (iVar7 = (int)uVar8, 0 < iVar7) {
          uVar9 = (ulong)(iVar7 - 1);
          iVar7 = piVar4[uVar9];
          dVar2 = (this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7].boundval;
          ppVar1 = (this->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar7;
          bVar6 = NAN(ppVar1->first);
          bVar5 = dVar2 != ppVar1->first;
          if (bVar5) {
            uVar9 = uVar8 & 0xffffffff;
          }
          if (NAN(dVar2) || bVar6) {
            uVar9 = uVar8 & 0xffffffff;
          }
          uVar8 = uVar9;
          iVar7 = (int)uVar8;
          if ((bVar5) || (NAN(dVar2) || bVar6)) break;
        }
        ConflictSet::resolveDepth
                  ((ConflictSet *)local_e8,
                   (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    *)&local_a8,iVar7,0,0,false);
        HighsConflictPool::addReconvergenceCut
                  (conflictPool,this,
                   (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    *)&local_a8,domchg);
      }
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48);
    }
    if (local_60 != (LocalDomChg *)0x0) {
      operator_delete(local_60);
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    std::
    _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::~_Rb_tree((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 *)(local_e8 + 0x10));
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalyzeReconvergence(
    const HighsDomainChange& domchg, const HighsInt* proofinds,
    const double* proofvals, HighsInt prooflen, double proofrhs,
    HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  HighsInt ninfmin;
  HighsCDouble activitymin;
  mipsolver->mipdata_->domain.computeMinActivity(
      0, prooflen, proofinds, proofvals, ninfmin, activitymin);
  if (ninfmin != 0) return;

  if (!conflictSet.explainBoundChangeLeq(
          conflictSet.reconvergenceFrontier,
          ConflictSet::LocalDomChg{HighsInt(domchgstack_.size()), domchg},
          proofinds, proofvals, prooflen, proofrhs, double(activitymin)))
    return;

  if (10 * conflictSet.resolvedDomainChanges.size() >
      1000 + 3 * mipsolver->mipdata_->integral_cols.size())
    return;

  conflictSet.reconvergenceFrontier.insert(
      conflictSet.resolvedDomainChanges.begin(),
      conflictSet.resolvedDomainChanges.end());

  HighsInt depth = branchPos_.size();

  while (depth > 0) {
    HighsInt branchPos = branchPos_[depth - 1];
    if (domchgstack_[branchPos].boundval != prevboundval_[branchPos].first)
      break;

    --depth;
  }

  conflictSet.resolveDepth(conflictSet.reconvergenceFrontier, depth, 0);
  conflictPool.addReconvergenceCut(*this, conflictSet.reconvergenceFrontier,
                                   domchg);
}